

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall customCountUnits_uniqueness_Test::TestBody(customCountUnits_uniqueness_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_R9;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  precise_unit local_1c0;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_130;
  Message local_128;
  precise_unit local_120;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  precise_unit cunit2;
  uint16_t jj;
  Message local_90;
  unit_data local_88;
  uint16_t local_82;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  unit_data local_50;
  uint16_t local_4a;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  precise_unit cunit1inv;
  precise_unit cunit1;
  uint16_t ii;
  customCountUnits_uniqueness_Test *this_local;
  
  for (cunit1.commodity_._2_2_ = 0; cunit1.commodity_._2_2_ < 0x10;
      cunit1.commodity_._2_2_ = cunit1.commodity_._2_2_ + 1) {
    join_0x00000000_0x00001200_ =
         units::precise::generate_custom_count_unit(cunit1.commodity_._2_2_);
    join_0x00000000_0x00001200_ = units::precise_unit::inv((precise_unit *)&cunit1inv.base_units_);
    local_50 = units::precise_unit::base_units((precise_unit *)&cunit1inv.base_units_);
    local_4a = units::precise::custom::custom_count_unit_number(&local_50);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              ((EqHelper *)local_48,"precise::custom::custom_count_unit_number(cunit1.base_units())"
               ,"ii",&local_4a,(unsigned_short *)((long)&cunit1.commodity_ + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      testing::Message::Message(local_68);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x47d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_68);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    local_88 = units::precise_unit::base_units((precise_unit *)&cunit1inv.base_units_);
    local_82 = units::precise::custom::custom_count_unit_number(&local_88);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              ((EqHelper *)local_80,"precise::custom::custom_count_unit_number(cunit1.base_units())"
               ,"ii",&local_82,(unsigned_short *)((long)&cunit1.commodity_ + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x47f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff68,&local_90)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff68);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    for (cunit2.commodity_._2_2_ = 0; cunit2.commodity_._2_2_ < 0x10;
        cunit2.commodity_._2_2_ = cunit2.commodity_._2_2_ + 1) {
      if (cunit1.commodity_._2_2_ != cunit2.commodity_._2_2_) {
        join_0x00000000_0x00001200_ =
             units::precise::generate_custom_count_unit(cunit2.commodity_._2_2_);
        local_c1 = units::precise_unit::operator==
                             ((precise_unit *)&cunit1inv.base_units_,
                              (precise_unit *)&gtest_ar_.message_);
        local_c1 = !local_c1;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_c0,&local_c1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
        if (!bVar1) {
          testing::Message::Message(&local_d0);
          pMVar3 = testing::Message::operator<<
                             (&local_d0,(char (*) [37])"Error with false comparison 1 index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1.message_,(internal *)local_c0,
                     (AssertionResult *)"cunit1 == cunit2","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x485,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d8,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_d8);
          std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
        local_120 = units::precise_unit::inv((precise_unit *)&gtest_ar_.message_);
        local_109 = units::precise_unit::operator==
                              ((precise_unit *)&cunit1inv.base_units_,&local_120);
        local_109 = !local_109;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_108,&local_109,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          pMVar3 = testing::Message::operator<<
                             (&local_128,(char (*) [41])"Error with false comparison 1 inv index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__2.message_,(internal *)local_108,
                     (AssertionResult *)"cunit1 == cunit2.inv()","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x487,pcVar2);
          testing::internal::AssertHelper::operator=(&local_130,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        local_161 = units::precise_unit::operator==
                              ((precise_unit *)&gtest_ar.message_,
                               (precise_unit *)&gtest_ar_.message_);
        local_161 = !local_161;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_160,&local_161,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_170);
          pMVar3 = testing::Message::operator<<
                             (&local_170,(char (*) [41])"Error with false inv comparison 2 index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_160,
                     (AssertionResult *)"cunit1inv == cunit2","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x48a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_178,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        local_1c0 = units::precise_unit::inv((precise_unit *)&gtest_ar_.message_);
        local_1a9 = units::precise_unit::operator==((precise_unit *)&gtest_ar.message_,&local_1c0);
        local_1a9 = !local_1a9;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pMVar3 = testing::Message::operator<<
                             (&local_1c8,
                              (char (*) [45])"Error with false inv comparison 2 inv index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1f0,(internal *)local_1a8,(AssertionResult *)"cunit1inv == cunit2.inv()"
                     ,"true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x48d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1d0,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
      }
    }
  }
  return;
}

Assistant:

TEST(customCountUnits, uniqueness)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        auto cunit1inv = cunit1.inv();

        EXPECT_EQ(
            precise::custom::custom_count_unit_number(cunit1.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_count_unit_number(cunit1.base_units()), ii);
        for (std::uint16_t jj = 0; jj < 16; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_count_unit(jj);
            EXPECT_FALSE(cunit1 == cunit2)
                << "Error with false comparison 1 index " << ii << "," << jj;
            EXPECT_FALSE(cunit1 == cunit2.inv())
                << "Error with false comparison 1 inv index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2)
                << "Error with false inv comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2.inv())
                << "Error with false inv comparison 2 inv index " << ii << ","
                << jj;
        }
    }
}